

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seose_compat.cpp
# Opt level: O0

string * seose_str_hash(string *__return_storage_ptr__,string *input,string *key)

{
  ulong uVar1;
  uint16_t input_00;
  ulong uVar2;
  byte *pbVar3;
  char *input_01;
  size_t length;
  string local_58;
  byte local_31;
  ulong uStack_30;
  uchar kc;
  size_t i;
  string *local_20;
  string *key_local;
  string *input_local;
  string *result;
  
  i._7_1_ = 0;
  local_20 = key;
  key_local = input;
  input_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (uStack_30 = 0; uVar1 = uStack_30, uVar2 = std::__cxx11::string::length(), uVar1 < uVar2;
      uStack_30 = uStack_30 + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)local_20);
    local_31 = *pbVar3;
    if (local_31 == 0x23) {
      local_31 = 0xa3;
    }
    input_01 = (char *)std::__cxx11::string::data();
    length = std::__cxx11::string::length();
    input_00 = seose_hash(input_01,length,((short)uStack_30 + 1) * (ushort)local_31);
    seose_to_base62_abi_cxx11_(&local_58,input_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string seose_str_hash(const std::string& input, const std::string& key)
{
	std::string result;

	for (std::size_t i = 0; i < key.length(); ++i)
	{
		unsigned char kc = key[i];

		// Remind me to strangle Sordie for using pound symbols in the default key
		if (kc == '#')
			kc = char(0xA3); // pound character

		result += seose_to_base62(seose_hash(input.data(), input.length(), (i + 1) * kc));
	}

	return result;
}